

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void rhash_sha512_process_block(uint64_t *hash,uint64_t *block)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t T1_31;
  uint64_t T1_30;
  uint64_t T1_29;
  uint64_t T1_28;
  uint64_t T1_27;
  uint64_t T1_26;
  uint64_t T1_25;
  uint64_t T1_24;
  uint64_t T1_23;
  uint64_t T1_22;
  uint64_t T1_21;
  uint64_t T1_20;
  uint64_t T1_19;
  uint64_t T1_18;
  uint64_t T1_17;
  uint64_t T1_16;
  uint64_t T1_15;
  uint64_t T1_14;
  uint64_t T1_13;
  uint64_t T1_12;
  uint64_t T1_11;
  uint64_t T1_10;
  uint64_t T1_9;
  uint64_t T1_8;
  uint64_t T1_7;
  uint64_t T1_6;
  uint64_t T1_5;
  uint64_t T1_4;
  uint64_t T1_3;
  uint64_t T1_2;
  uint64_t T1_1;
  uint64_t T1;
  uint64_t *puStack_e0;
  int i;
  uint64_t *k;
  uint64_t W [16];
  uint64_t H;
  uint64_t G;
  uint64_t F;
  uint64_t E;
  uint64_t D;
  uint64_t C;
  uint64_t B;
  uint64_t A;
  uint64_t *block_local;
  uint64_t *hash_local;
  
  uVar8 = *hash;
  uVar6 = hash[1];
  uVar12 = hash[4];
  uVar9 = hash[5];
  uVar7 = hash[6];
  lVar1 = hash[7] + (uVar12 >> 0xe ^ uVar12 << 0x32 ^ uVar12 >> 0x12 ^ uVar12 << 0x2e ^
                    uVar12 >> 0x29 ^ uVar12 << 0x17) + (uVar7 ^ uVar12 & (uVar9 ^ uVar7)) +
          0x428a2f98d728ae22;
  uVar4 = *block;
  k = (uint64_t *)
      (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
  uVar2 = (long)k + hash[3] + lVar1;
  uVar3 = (long)k + (uVar8 & uVar6 ^ hash[2] & (uVar8 ^ uVar6)) +
                    (uVar8 >> 0x1c ^ uVar8 << 0x24 ^ uVar8 >> 0x22 ^ uVar8 << 0x1e ^
                    uVar8 >> 0x27 ^ uVar8 << 0x19) + lVar1;
  uVar4 = block[1];
  W[0] = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  lVar1 = uVar7 + (uVar2 >> 0xe ^ uVar2 << 0x32 ^ uVar2 >> 0x12 ^ uVar2 << 0x2e ^
                  uVar2 >> 0x29 ^ uVar2 * 0x800000) + (uVar9 ^ uVar2 & (uVar12 ^ uVar9)) +
          0x7137449123ef65cd + W[0];
  uVar4 = lVar1 + hash[2];
  uVar5 = lVar1 + (uVar3 >> 0x1c ^ uVar3 << 0x24 ^ uVar3 >> 0x22 ^ uVar3 * 0x40000000 ^
                  uVar3 >> 0x27 ^ uVar3 * 0x2000000) + (uVar3 & uVar8 ^ uVar6 & (uVar3 ^ uVar8));
  uVar7 = block[2];
  W[1] = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
         (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
  lVar1 = uVar9 + (uVar4 >> 0xe ^ uVar4 << 0x32 ^ uVar4 >> 0x12 ^ uVar4 << 0x2e ^
                  uVar4 >> 0x29 ^ uVar4 * 0x800000) + (uVar12 ^ uVar4 & (uVar2 ^ uVar12)) +
          0xb5c0fbcfec4d3b2f + W[1];
  uVar6 = lVar1 + uVar6;
  uVar7 = lVar1 + (uVar5 >> 0x1c ^ uVar5 << 0x24 ^ uVar5 >> 0x22 ^ uVar5 * 0x40000000 ^
                  uVar5 >> 0x27 ^ uVar5 * 0x2000000) + (uVar5 & uVar3 ^ uVar8 & (uVar5 ^ uVar3));
  uVar9 = block[3];
  W[2] = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  lVar1 = uVar12 + (uVar6 >> 0xe ^ uVar6 << 0x32 ^ uVar6 >> 0x12 ^ uVar6 << 0x2e ^
                   uVar6 >> 0x29 ^ uVar6 * 0x800000) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) +
          0xe9b5dba58189dbbc + W[2];
  uVar8 = lVar1 + uVar8;
  uVar9 = lVar1 + (uVar7 >> 0x1c ^ uVar7 << 0x24 ^ uVar7 >> 0x22 ^ uVar7 * 0x40000000 ^
                  uVar7 >> 0x27 ^ uVar7 * 0x2000000) + (uVar7 & uVar5 ^ uVar3 & (uVar7 ^ uVar5));
  uVar12 = block[4];
  W[3] = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  lVar1 = uVar2 + (uVar8 >> 0xe ^ uVar8 << 0x32 ^ uVar8 >> 0x12 ^ uVar8 << 0x2e ^
                  uVar8 >> 0x29 ^ uVar8 * 0x800000) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) +
          0x3956c25bf348b538 + W[3];
  uVar3 = lVar1 + uVar3;
  uVar2 = lVar1 + (uVar9 >> 0x1c ^ uVar9 << 0x24 ^ uVar9 >> 0x22 ^ uVar9 * 0x40000000 ^
                  uVar9 >> 0x27 ^ uVar9 * 0x2000000) + (uVar9 & uVar7 ^ uVar5 & (uVar9 ^ uVar7));
  uVar12 = block[5];
  W[4] = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  lVar1 = uVar4 + (uVar3 >> 0xe ^ uVar3 << 0x32 ^ uVar3 >> 0x12 ^ uVar3 << 0x2e ^
                  uVar3 >> 0x29 ^ uVar3 * 0x800000) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) +
          0x59f111f1b605d019 + W[4];
  uVar5 = lVar1 + uVar5;
  uVar4 = lVar1 + (uVar2 >> 0x1c ^ uVar2 << 0x24 ^ uVar2 >> 0x22 ^ uVar2 * 0x40000000 ^
                  uVar2 >> 0x27 ^ uVar2 * 0x2000000) + (uVar2 & uVar9 ^ uVar7 & (uVar2 ^ uVar9));
  uVar12 = block[6];
  W[5] = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  lVar1 = uVar6 + (uVar5 >> 0xe ^ uVar5 << 0x32 ^ uVar5 >> 0x12 ^ uVar5 << 0x2e ^
                  uVar5 >> 0x29 ^ uVar5 * 0x800000) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) +
          0x923f82a4af194f9b + W[5];
  uVar7 = lVar1 + uVar7;
  uVar10 = lVar1 + (uVar4 >> 0x1c ^ uVar4 << 0x24 ^ uVar4 >> 0x22 ^ uVar4 * 0x40000000 ^
                   uVar4 >> 0x27 ^ uVar4 * 0x2000000) + (uVar4 & uVar2 ^ uVar9 & (uVar4 ^ uVar2));
  uVar6 = block[7];
  W[6] = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  lVar1 = uVar8 + (uVar7 >> 0xe ^ uVar7 << 0x32 ^ uVar7 >> 0x12 ^ uVar7 << 0x2e ^
                  uVar7 >> 0x29 ^ uVar7 * 0x800000) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) +
          0xab1c5ed5da6d8118 + W[6];
  uVar9 = lVar1 + uVar9;
  uVar11 = lVar1 + (uVar10 >> 0x1c ^ uVar10 << 0x24 ^ uVar10 >> 0x22 ^ uVar10 * 0x40000000 ^
                   uVar10 >> 0x27 ^ uVar10 * 0x2000000) +
           (uVar10 & uVar4 ^ uVar2 & (uVar10 ^ uVar4));
  uVar8 = block[8];
  W[7] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar3 + (uVar9 >> 0xe ^ uVar9 << 0x32 ^ uVar9 >> 0x12 ^ uVar9 << 0x2e ^
                  uVar9 >> 0x29 ^ uVar9 * 0x800000) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) +
          0xd807aa98a3030242 + W[7];
  uVar2 = lVar1 + uVar2;
  uVar6 = lVar1 + (uVar11 >> 0x1c ^ uVar11 << 0x24 ^ uVar11 >> 0x22 ^ uVar11 * 0x40000000 ^
                  uVar11 >> 0x27 ^ uVar11 * 0x2000000) +
          (uVar11 & uVar10 ^ uVar4 & (uVar11 ^ uVar10));
  uVar8 = block[9];
  W[8] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar5 + (uVar2 >> 0xe ^ uVar2 << 0x32 ^ uVar2 >> 0x12 ^ uVar2 << 0x2e ^
                  uVar2 >> 0x29 ^ uVar2 * 0x800000) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) +
          0x12835b0145706fbe + W[8];
  uVar4 = lVar1 + uVar4;
  uVar12 = lVar1 + (uVar6 >> 0x1c ^ uVar6 << 0x24 ^ uVar6 >> 0x22 ^ uVar6 * 0x40000000 ^
                   uVar6 >> 0x27 ^ uVar6 * 0x2000000) + (uVar6 & uVar11 ^ uVar10 & (uVar6 ^ uVar11))
  ;
  uVar8 = block[10];
  W[9] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar7 + (uVar4 >> 0xe ^ uVar4 << 0x32 ^ uVar4 >> 0x12 ^ uVar4 << 0x2e ^
                  uVar4 >> 0x29 ^ uVar4 * 0x800000) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) +
          0x243185be4ee4b28c + W[9];
  uVar10 = lVar1 + uVar10;
  uVar7 = lVar1 + (uVar12 >> 0x1c ^ uVar12 << 0x24 ^ uVar12 >> 0x22 ^ uVar12 * 0x40000000 ^
                  uVar12 >> 0x27 ^ uVar12 * 0x2000000) +
          (uVar12 & uVar6 ^ uVar11 & (uVar12 ^ uVar6));
  uVar8 = block[0xb];
  W[10] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar9 + (uVar10 >> 0xe ^ uVar10 << 0x32 ^ uVar10 >> 0x12 ^ uVar10 << 0x2e ^
                  uVar10 >> 0x29 ^ uVar10 * 0x800000) + (uVar2 ^ uVar10 & (uVar4 ^ uVar2)) +
          0x550c7dc3d5ffb4e2 + W[10];
  uVar11 = lVar1 + uVar11;
  uVar9 = lVar1 + (uVar7 >> 0x1c ^ uVar7 << 0x24 ^ uVar7 >> 0x22 ^ uVar7 * 0x40000000 ^
                  uVar7 >> 0x27 ^ uVar7 * 0x2000000) + (uVar7 & uVar12 ^ uVar6 & (uVar7 ^ uVar12));
  uVar8 = block[0xc];
  W[0xb] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
           (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
           (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar2 + (uVar11 >> 0xe ^ uVar11 << 0x32 ^ uVar11 >> 0x12 ^ uVar11 << 0x2e ^
                  uVar11 >> 0x29 ^ uVar11 * 0x800000) + (uVar4 ^ uVar11 & (uVar10 ^ uVar4)) +
          0x72be5d74f27b896f + W[0xb];
  W[0xf] = lVar1 + uVar6;
  E = lVar1 + (uVar9 >> 0x1c ^ uVar9 << 0x24 ^ uVar9 >> 0x22 ^ uVar9 * 0x40000000 ^
              uVar9 >> 0x27 ^ uVar9 * 0x2000000) + (uVar9 & uVar7 ^ uVar12 & (uVar9 ^ uVar7));
  uVar8 = block[0xd];
  W[0xc] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
           (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
           (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar4 + (W[0xf] >> 0xe ^ W[0xf] << 0x32 ^ W[0xf] >> 0x12 ^ W[0xf] << 0x2e ^
                  W[0xf] >> 0x29 ^ W[0xf] * 0x800000) + (uVar10 ^ W[0xf] & (uVar11 ^ uVar10)) +
          0x80deb1fe3b1696b1 + W[0xc];
  H = lVar1 + uVar12;
  D = lVar1 + (E >> 0x1c ^ E << 0x24 ^ E >> 0x22 ^ E * 0x40000000 ^ E >> 0x27 ^ E * 0x2000000) +
      (E & uVar9 ^ uVar7 & (E ^ uVar9));
  uVar8 = block[0xe];
  W[0xd] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
           (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
           (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar10 + (H >> 0xe ^ H << 0x32 ^ H >> 0x12 ^ H << 0x2e ^ H >> 0x29 ^ H * 0x800000) +
          (uVar11 ^ H & (W[0xf] ^ uVar11)) + 0x9bdc06a725c71235 + W[0xd];
  G = lVar1 + uVar7;
  C = lVar1 + (D >> 0x1c ^ D << 0x24 ^ D >> 0x22 ^ D * 0x40000000 ^ D >> 0x27 ^ D * 0x2000000) +
      (D & E ^ uVar9 & (D ^ E));
  uVar8 = block[0xf];
  W[0xe] = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
           (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
           (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar1 = uVar11 + (G >> 0xe ^ G << 0x32 ^ G >> 0x12 ^ G << 0x2e ^ G >> 0x29 ^ G * 0x800000) +
          (W[0xf] ^ G & (H ^ W[0xf])) + 0xc19bf174cf692694 + W[0xe];
  F = lVar1 + uVar9;
  B = lVar1 + (C >> 0x1c ^ C << 0x24 ^ C >> 0x22 ^ C * 0x40000000 ^ C >> 0x27 ^ C * 0x2000000) +
      (C & D ^ E & (C ^ D));
  puStack_e0 = rhash_k512;
  for (T1._4_4_ = 0x10; puStack_e0 = puStack_e0 + 0x10, T1._4_4_ < 0x50; T1._4_4_ = T1._4_4_ + 0x10)
  {
    lVar1 = W[0xf] + (F >> 0xe ^ F << 0x32 ^ F >> 0x12 ^ F << 0x2e ^ F >> 0x29 ^ F << 0x17) +
            (H ^ F & (G ^ H)) + *puStack_e0;
    k = (uint64_t *)
        ((W[0xd] >> 0x13 ^ W[0xd] << 0x2d ^ W[0xd] >> 0x3d ^ W[0xd] << 3 ^ W[0xd] >> 6) + W[8] +
         (W[0] >> 1 ^ W[0] << 0x3f ^ W[0] >> 8 ^ W[0] << 0x38 ^ W[0] >> 7) + (long)k);
    uVar8 = (long)k + E + lVar1;
    uVar7 = (long)k + (B & C ^ D & (B ^ C)) +
                      (B >> 0x1c ^ B << 0x24 ^ B >> 0x22 ^ B << 0x1e ^ B >> 0x27 ^ B << 0x19) +
                      lVar1;
    W[0] = (W[0xe] >> 0x13 ^ W[0xe] << 0x2d ^ W[0xe] >> 0x3d ^ W[0xe] << 3 ^ W[0xe] >> 6) + W[9] +
           (W[1] >> 1 ^ W[1] << 0x3f ^ W[1] >> 8 ^ W[1] << 0x38 ^ W[1] >> 7) + W[0];
    lVar1 = H + (uVar8 >> 0xe ^ uVar8 << 0x32 ^ uVar8 >> 0x12 ^ uVar8 << 0x2e ^
                uVar8 >> 0x29 ^ uVar8 * 0x800000) + (G ^ uVar8 & (F ^ G)) + puStack_e0[1] + W[0];
    uVar6 = lVar1 + D;
    uVar4 = lVar1 + (uVar7 >> 0x1c ^ uVar7 << 0x24 ^ uVar7 >> 0x22 ^ uVar7 * 0x40000000 ^
                    uVar7 >> 0x27 ^ uVar7 * 0x2000000) + (uVar7 & B ^ C & (uVar7 ^ B));
    W[1] = ((ulong)k >> 0x13 ^ (long)k << 0x2d ^ (ulong)k >> 0x3d ^ (long)k * 8 ^ (ulong)k >> 6) +
           W[10] + (W[2] >> 1 ^ W[2] << 0x3f ^ W[2] >> 8 ^ W[2] << 0x38 ^ W[2] >> 7) + W[1];
    lVar1 = G + (uVar6 >> 0xe ^ uVar6 << 0x32 ^ uVar6 >> 0x12 ^ uVar6 << 0x2e ^
                uVar6 >> 0x29 ^ uVar6 * 0x800000) + (F ^ uVar6 & (uVar8 ^ F)) + puStack_e0[2] + W[1]
    ;
    uVar12 = lVar1 + C;
    uVar2 = lVar1 + (uVar4 >> 0x1c ^ uVar4 << 0x24 ^ uVar4 >> 0x22 ^ uVar4 * 0x40000000 ^
                    uVar4 >> 0x27 ^ uVar4 * 0x2000000) + (uVar4 & uVar7 ^ B & (uVar4 ^ uVar7));
    W[2] = (W[0] >> 0x13 ^ W[0] << 0x2d ^ W[0] >> 0x3d ^ W[0] * 8 ^ W[0] >> 6) + W[0xb] +
           (W[3] >> 1 ^ W[3] << 0x3f ^ W[3] >> 8 ^ W[3] << 0x38 ^ W[3] >> 7) + W[2];
    lVar1 = F + (uVar12 >> 0xe ^ uVar12 << 0x32 ^ uVar12 >> 0x12 ^ uVar12 << 0x2e ^
                uVar12 >> 0x29 ^ uVar12 * 0x800000) + (uVar8 ^ uVar12 & (uVar6 ^ uVar8)) +
            puStack_e0[3] + W[2];
    uVar9 = lVar1 + B;
    uVar3 = lVar1 + (uVar2 >> 0x1c ^ uVar2 << 0x24 ^ uVar2 >> 0x22 ^ uVar2 * 0x40000000 ^
                    uVar2 >> 0x27 ^ uVar2 * 0x2000000) + (uVar2 & uVar4 ^ uVar7 & (uVar2 ^ uVar4));
    W[3] = (W[1] >> 0x13 ^ W[1] << 0x2d ^ W[1] >> 0x3d ^ W[1] * 8 ^ W[1] >> 6) + W[0xc] +
           (W[4] >> 1 ^ W[4] << 0x3f ^ W[4] >> 8 ^ W[4] << 0x38 ^ W[4] >> 7) + W[3];
    lVar1 = uVar8 + (uVar9 >> 0xe ^ uVar9 << 0x32 ^ uVar9 >> 0x12 ^ uVar9 << 0x2e ^
                    uVar9 >> 0x29 ^ uVar9 * 0x800000) + (uVar6 ^ uVar9 & (uVar12 ^ uVar6)) +
            puStack_e0[4] + W[3];
    uVar7 = lVar1 + uVar7;
    uVar8 = lVar1 + (uVar3 >> 0x1c ^ uVar3 << 0x24 ^ uVar3 >> 0x22 ^ uVar3 * 0x40000000 ^
                    uVar3 >> 0x27 ^ uVar3 * 0x2000000) + (uVar3 & uVar2 ^ uVar4 & (uVar3 ^ uVar2));
    W[4] = (W[2] >> 0x13 ^ W[2] << 0x2d ^ W[2] >> 0x3d ^ W[2] * 8 ^ W[2] >> 6) + W[0xd] +
           (W[5] >> 1 ^ W[5] << 0x3f ^ W[5] >> 8 ^ W[5] << 0x38 ^ W[5] >> 7) + W[4];
    lVar1 = uVar6 + (uVar7 >> 0xe ^ uVar7 << 0x32 ^ uVar7 >> 0x12 ^ uVar7 << 0x2e ^
                    uVar7 >> 0x29 ^ uVar7 * 0x800000) + (uVar12 ^ uVar7 & (uVar9 ^ uVar12)) +
            puStack_e0[5] + W[4];
    uVar4 = lVar1 + uVar4;
    uVar5 = lVar1 + (uVar8 >> 0x1c ^ uVar8 << 0x24 ^ uVar8 >> 0x22 ^ uVar8 * 0x40000000 ^
                    uVar8 >> 0x27 ^ uVar8 * 0x2000000) + (uVar8 & uVar3 ^ uVar2 & (uVar8 ^ uVar3));
    W[5] = (W[3] >> 0x13 ^ W[3] << 0x2d ^ W[3] >> 0x3d ^ W[3] * 8 ^ W[3] >> 6) + W[0xe] +
           (W[6] >> 1 ^ W[6] << 0x3f ^ W[6] >> 8 ^ W[6] << 0x38 ^ W[6] >> 7) + W[5];
    lVar1 = uVar12 + (uVar4 >> 0xe ^ uVar4 << 0x32 ^ uVar4 >> 0x12 ^ uVar4 << 0x2e ^
                     uVar4 >> 0x29 ^ uVar4 * 0x800000) + (uVar9 ^ uVar4 & (uVar7 ^ uVar9)) +
            puStack_e0[6] + W[5];
    uVar2 = lVar1 + uVar2;
    uVar10 = lVar1 + (uVar5 >> 0x1c ^ uVar5 << 0x24 ^ uVar5 >> 0x22 ^ uVar5 * 0x40000000 ^
                     uVar5 >> 0x27 ^ uVar5 * 0x2000000) + (uVar5 & uVar8 ^ uVar3 & (uVar5 ^ uVar8));
    W[6] = (long)k + W[6] + (W[7] >> 1 ^ W[7] << 0x3f ^ W[7] >> 8 ^ W[7] << 0x38 ^ W[7] >> 7) +
                            (W[4] >> 0x13 ^ W[4] << 0x2d ^ W[4] >> 0x3d ^ W[4] * 8 ^ W[4] >> 6);
    lVar1 = uVar9 + (uVar2 >> 0xe ^ uVar2 << 0x32 ^ uVar2 >> 0x12 ^ uVar2 << 0x2e ^
                    uVar2 >> 0x29 ^ uVar2 * 0x800000) + (uVar7 ^ uVar2 & (uVar4 ^ uVar7)) +
            puStack_e0[7] + W[6];
    uVar3 = lVar1 + uVar3;
    uVar11 = lVar1 + (uVar10 >> 0x1c ^ uVar10 << 0x24 ^ uVar10 >> 0x22 ^ uVar10 * 0x40000000 ^
                     uVar10 >> 0x27 ^ uVar10 * 0x2000000) +
             (uVar10 & uVar5 ^ uVar8 & (uVar10 ^ uVar5));
    W[7] = (W[5] >> 0x13 ^ W[5] << 0x2d ^ W[5] >> 0x3d ^ W[5] * 8 ^ W[5] >> 6) + W[0] +
           (W[8] >> 1 ^ W[8] << 0x3f ^ W[8] >> 8 ^ W[8] << 0x38 ^ W[8] >> 7) + W[7];
    lVar1 = uVar7 + (uVar3 >> 0xe ^ uVar3 << 0x32 ^ uVar3 >> 0x12 ^ uVar3 << 0x2e ^
                    uVar3 >> 0x29 ^ uVar3 * 0x800000) + (uVar4 ^ uVar3 & (uVar2 ^ uVar4)) +
            puStack_e0[8] + W[7];
    uVar8 = lVar1 + uVar8;
    uVar6 = lVar1 + (uVar11 >> 0x1c ^ uVar11 << 0x24 ^ uVar11 >> 0x22 ^ uVar11 * 0x40000000 ^
                    uVar11 >> 0x27 ^ uVar11 * 0x2000000) +
            (uVar11 & uVar10 ^ uVar5 & (uVar11 ^ uVar10));
    W[8] = (W[6] >> 0x13 ^ W[6] << 0x2d ^ W[6] >> 0x3d ^ W[6] * 8 ^ W[6] >> 6) + W[1] +
           (W[9] >> 1 ^ W[9] << 0x3f ^ W[9] >> 8 ^ W[9] << 0x38 ^ W[9] >> 7) + W[8];
    lVar1 = uVar4 + (uVar8 >> 0xe ^ uVar8 << 0x32 ^ uVar8 >> 0x12 ^ uVar8 << 0x2e ^
                    uVar8 >> 0x29 ^ uVar8 * 0x800000) + (uVar2 ^ uVar8 & (uVar3 ^ uVar2)) +
            puStack_e0[9] + W[8];
    uVar5 = lVar1 + uVar5;
    uVar12 = lVar1 + (uVar6 >> 0x1c ^ uVar6 << 0x24 ^ uVar6 >> 0x22 ^ uVar6 * 0x40000000 ^
                     uVar6 >> 0x27 ^ uVar6 * 0x2000000) +
             (uVar6 & uVar11 ^ uVar10 & (uVar6 ^ uVar11));
    W[9] = (W[7] >> 0x13 ^ W[7] << 0x2d ^ W[7] >> 0x3d ^ W[7] * 8 ^ W[7] >> 6) + W[2] +
           (W[10] >> 1 ^ W[10] << 0x3f ^ W[10] >> 8 ^ W[10] << 0x38 ^ W[10] >> 7) + W[9];
    lVar1 = uVar2 + (uVar5 >> 0xe ^ uVar5 << 0x32 ^ uVar5 >> 0x12 ^ uVar5 << 0x2e ^
                    uVar5 >> 0x29 ^ uVar5 * 0x800000) + (uVar3 ^ uVar5 & (uVar8 ^ uVar3)) +
            puStack_e0[10] + W[9];
    uVar10 = lVar1 + uVar10;
    uVar9 = lVar1 + (uVar12 >> 0x1c ^ uVar12 << 0x24 ^ uVar12 >> 0x22 ^ uVar12 * 0x40000000 ^
                    uVar12 >> 0x27 ^ uVar12 * 0x2000000) +
            (uVar12 & uVar6 ^ uVar11 & (uVar12 ^ uVar6));
    W[10] = (W[8] >> 0x13 ^ W[8] << 0x2d ^ W[8] >> 0x3d ^ W[8] * 8 ^ W[8] >> 6) + W[3] +
            (W[0xb] >> 1 ^ W[0xb] << 0x3f ^ W[0xb] >> 8 ^ W[0xb] << 0x38 ^ W[0xb] >> 7) + W[10];
    lVar1 = uVar3 + (uVar10 >> 0xe ^ uVar10 << 0x32 ^ uVar10 >> 0x12 ^ uVar10 << 0x2e ^
                    uVar10 >> 0x29 ^ uVar10 * 0x800000) + (uVar8 ^ uVar10 & (uVar5 ^ uVar8)) +
            puStack_e0[0xb] + W[10];
    uVar11 = lVar1 + uVar11;
    uVar7 = lVar1 + (uVar9 >> 0x1c ^ uVar9 << 0x24 ^ uVar9 >> 0x22 ^ uVar9 * 0x40000000 ^
                    uVar9 >> 0x27 ^ uVar9 * 0x2000000) + (uVar9 & uVar12 ^ uVar6 & (uVar9 ^ uVar12))
    ;
    W[0xb] = (W[9] >> 0x13 ^ W[9] << 0x2d ^ W[9] >> 0x3d ^ W[9] * 8 ^ W[9] >> 6) + W[4] +
             (W[0xc] >> 1 ^ W[0xc] << 0x3f ^ W[0xc] >> 8 ^ W[0xc] << 0x38 ^ W[0xc] >> 7) + W[0xb];
    lVar1 = uVar8 + (uVar11 >> 0xe ^ uVar11 << 0x32 ^ uVar11 >> 0x12 ^ uVar11 << 0x2e ^
                    uVar11 >> 0x29 ^ uVar11 * 0x800000) + (uVar5 ^ uVar11 & (uVar10 ^ uVar5)) +
            puStack_e0[0xc] + W[0xb];
    W[0xf] = lVar1 + uVar6;
    E = lVar1 + (uVar7 >> 0x1c ^ uVar7 << 0x24 ^ uVar7 >> 0x22 ^ uVar7 * 0x40000000 ^
                uVar7 >> 0x27 ^ uVar7 * 0x2000000) + (uVar7 & uVar9 ^ uVar12 & (uVar7 ^ uVar9));
    W[0xc] = (W[10] >> 0x13 ^ W[10] << 0x2d ^ W[10] >> 0x3d ^ W[10] * 8 ^ W[10] >> 6) + W[5] +
             (W[0xd] >> 1 ^ W[0xd] << 0x3f ^ W[0xd] >> 8 ^ W[0xd] << 0x38 ^ W[0xd] >> 7) + W[0xc];
    lVar1 = uVar5 + (W[0xf] >> 0xe ^ W[0xf] << 0x32 ^ W[0xf] >> 0x12 ^ W[0xf] << 0x2e ^
                    W[0xf] >> 0x29 ^ W[0xf] * 0x800000) + (uVar10 ^ W[0xf] & (uVar11 ^ uVar10)) +
            puStack_e0[0xd] + W[0xc];
    H = lVar1 + uVar12;
    D = lVar1 + (E >> 0x1c ^ E << 0x24 ^ E >> 0x22 ^ E * 0x40000000 ^ E >> 0x27 ^ E * 0x2000000) +
        (E & uVar7 ^ uVar9 & (E ^ uVar7));
    W[0xd] = (W[0xb] >> 0x13 ^ W[0xb] << 0x2d ^ W[0xb] >> 0x3d ^ W[0xb] * 8 ^ W[0xb] >> 6) + W[6] +
             (W[0xe] >> 1 ^ W[0xe] << 0x3f ^ W[0xe] >> 8 ^ W[0xe] << 0x38 ^ W[0xe] >> 7) + W[0xd];
    lVar1 = uVar10 + (H >> 0xe ^ H << 0x32 ^ H >> 0x12 ^ H << 0x2e ^ H >> 0x29 ^ H * 0x800000) +
            (uVar11 ^ H & (W[0xf] ^ uVar11)) + puStack_e0[0xe] + W[0xd];
    G = lVar1 + uVar9;
    C = lVar1 + (D >> 0x1c ^ D << 0x24 ^ D >> 0x22 ^ D * 0x40000000 ^ D >> 0x27 ^ D * 0x2000000) +
        (D & E ^ uVar7 & (D ^ E));
    W[0xe] = (W[0xc] >> 0x13 ^ W[0xc] << 0x2d ^ W[0xc] >> 0x3d ^ W[0xc] * 8 ^ W[0xc] >> 6) + W[7] +
             ((ulong)k >> 1 ^ (long)k << 0x3f ^ (ulong)k >> 8 ^ (long)k << 0x38 ^ (ulong)k >> 7) +
             W[0xe];
    lVar1 = uVar11 + (G >> 0xe ^ G << 0x32 ^ G >> 0x12 ^ G << 0x2e ^ G >> 0x29 ^ G * 0x800000) +
            (W[0xf] ^ G & (H ^ W[0xf])) + puStack_e0[0xf] + W[0xe];
    F = lVar1 + uVar7;
    B = lVar1 + (C >> 0x1c ^ C << 0x24 ^ C >> 0x22 ^ C * 0x40000000 ^ C >> 0x27 ^ C * 0x2000000) +
        (C & D ^ E & (C ^ D));
  }
  *hash = B + *hash;
  hash[1] = C + hash[1];
  hash[2] = D + hash[2];
  hash[3] = E + hash[3];
  hash[4] = F + hash[4];
  hash[5] = G + hash[5];
  hash[6] = H + hash[6];
  hash[7] = W[0xf] + hash[7];
  return;
}

Assistant:

static void rhash_sha512_process_block(uint64_t hash[8], uint64_t block[16])
{
	uint64_t A, B, C, D, E, F, G, H;
	uint64_t W[16];
	const uint64_t *k;
	int i;

	A = hash[0], B = hash[1], C = hash[2], D = hash[3];
	E = hash[4], F = hash[5], G = hash[6], H = hash[7];

	/* Compute SHA using alternate Method: FIPS 180-3 6.1.3 */
	ROUND_1_16(A, B, C, D, E, F, G, H, 0);
	ROUND_1_16(H, A, B, C, D, E, F, G, 1);
	ROUND_1_16(G, H, A, B, C, D, E, F, 2);
	ROUND_1_16(F, G, H, A, B, C, D, E, 3);
	ROUND_1_16(E, F, G, H, A, B, C, D, 4);
	ROUND_1_16(D, E, F, G, H, A, B, C, 5);
	ROUND_1_16(C, D, E, F, G, H, A, B, 6);
	ROUND_1_16(B, C, D, E, F, G, H, A, 7);
	ROUND_1_16(A, B, C, D, E, F, G, H, 8);
	ROUND_1_16(H, A, B, C, D, E, F, G, 9);
	ROUND_1_16(G, H, A, B, C, D, E, F, 10);
	ROUND_1_16(F, G, H, A, B, C, D, E, 11);
	ROUND_1_16(E, F, G, H, A, B, C, D, 12);
	ROUND_1_16(D, E, F, G, H, A, B, C, 13);
	ROUND_1_16(C, D, E, F, G, H, A, B, 14);
	ROUND_1_16(B, C, D, E, F, G, H, A, 15);

	for (i = 16, k = &rhash_k512[16]; i < 80; i += 16, k += 16) {
		ROUND_17_80(A, B, C, D, E, F, G, H,  0);
		ROUND_17_80(H, A, B, C, D, E, F, G,  1);
		ROUND_17_80(G, H, A, B, C, D, E, F,  2);
		ROUND_17_80(F, G, H, A, B, C, D, E,  3);
		ROUND_17_80(E, F, G, H, A, B, C, D,  4);
		ROUND_17_80(D, E, F, G, H, A, B, C,  5);
		ROUND_17_80(C, D, E, F, G, H, A, B,  6);
		ROUND_17_80(B, C, D, E, F, G, H, A,  7);
		ROUND_17_80(A, B, C, D, E, F, G, H,  8);
		ROUND_17_80(H, A, B, C, D, E, F, G,  9);
		ROUND_17_80(G, H, A, B, C, D, E, F, 10);
		ROUND_17_80(F, G, H, A, B, C, D, E, 11);
		ROUND_17_80(E, F, G, H, A, B, C, D, 12);
		ROUND_17_80(D, E, F, G, H, A, B, C, 13);
		ROUND_17_80(C, D, E, F, G, H, A, B, 14);
		ROUND_17_80(B, C, D, E, F, G, H, A, 15);
	}

	hash[0] += A, hash[1] += B, hash[2] += C, hash[3] += D;
	hash[4] += E, hash[5] += F, hash[6] += G, hash[7] += H;
}